

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::applyFilenamesAsTags(IConfig *config)

{
  ulong uVar1;
  size_type sVar2;
  long lVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  size_type lastDot;
  size_type lastSlash;
  string filename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  TestCase *test;
  size_t i;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *tests;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef0;
  undefined1 in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff09;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string local_a8 [32];
  long local_88;
  string local_70 [80];
  const_reference local_20;
  ulong local_18;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *local_10;
  
  local_10 = getAllTestCasesSorted((IConfig *)0x185efc);
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    sVar2 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(local_10);
    if (sVar2 <= uVar1) break;
    local_20 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::operator[]
                         (local_10,local_18);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffef0._M_node,
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    std::__cxx11::string::string(local_70,(string *)&(local_20->super_TestCaseInfo).lineInfo);
    local_88 = std::__cxx11::string::find_last_of((char *)local_70,0x1d746f);
    if (local_88 != -1) {
      std::__cxx11::string::substr((ulong)local_a8,(ulong)local_70);
      std::__cxx11::string::operator=(local_70,local_a8);
      std::__cxx11::string::~string(local_a8);
    }
    lVar3 = std::__cxx11::string::find_last_of((char *)local_70,0x1d853e);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffff30,(ulong)local_70);
      std::__cxx11::string::operator=(local_70,(string *)&stack0xffffffffffffff30);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    }
    std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_ffffffffffffff10,
                     (value_type *)CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
    in_stack_fffffffffffffef0 = pVar4.first._M_node;
    in_stack_fffffffffffffeef = pVar4.second;
    in_stack_ffffffffffffff08 = in_stack_fffffffffffffeef;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    setTags((TestCaseInfo *)i,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)test);
    std::__cxx11::string::~string(local_70);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x186119);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void applyFilenamesAsTags( IConfig const& config ) {
        std::vector<TestCase> const& tests = getAllTestCasesSorted( config );
        for(std::size_t i = 0; i < tests.size(); ++i ) {
            TestCase& test = const_cast<TestCase&>( tests[i] );
            std::set<std::string> tags = test.tags;

            std::string filename = test.lineInfo.file;
            std::string::size_type lastSlash = filename.find_last_of( "\\/" );
            if( lastSlash != std::string::npos )
                filename = filename.substr( lastSlash+1 );

            std::string::size_type lastDot = filename.find_last_of( "." );
            if( lastDot != std::string::npos )
                filename = filename.substr( 0, lastDot );

            tags.insert( "#" + filename );
            setTags( test, tags );
        }
    }